

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>::
useBuffer(BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
          *this,int bufferSize)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
             ).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x1680))
            ((((this->
               super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
               ).m_dummyProgram)->m_program).m_program);
  (**(code **)(lVar2 + 0x1a00))(0,0,0x20,0x20);
  (**(code **)(lVar2 + 0x19f0))
            ((this->
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
             ).m_dummyProgramPosLoc,4,0x1406,0,0,0);
  (**(code **)(lVar2 + 0x610))
            ((this->
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
             ).m_dummyProgramPosLoc);
  (**(code **)(lVar2 + 0x538))(0,0,1);
  iVar1 = bufferSize + 0xf;
  if (-1 < bufferSize) {
    iVar1 = bufferSize;
  }
  (**(code **)(lVar2 + 0x538))(0,(iVar1 >> 4) + -1,1);
  BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>::
  waitGLResults(&this->
                 super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
               );
  return;
}

Assistant:

void BasicUploadCase<SampleType>::useBuffer (int bufferSize)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.useProgram(m_dummyProgram->getProgram());

	gl.viewport(0, 0, DUMMY_RENDER_AREA_SIZE, DUMMY_RENDER_AREA_SIZE);
	gl.vertexAttribPointer(m_dummyProgramPosLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.enableVertexAttribArray(m_dummyProgramPosLoc);

	// use whole buffer to make sure buffer is uploaded by drawing first and last
	DE_ASSERT(bufferSize % (int)sizeof(float[4]) == 0);
	gl.drawArrays(GL_POINTS, 0, 1);
	gl.drawArrays(GL_POINTS, bufferSize / (int)sizeof(float[4]) - 1, 1);

	BasicBufferCase<SampleType>::waitGLResults();
}